

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_compressBlock_lazy_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *pBVar1;
  undefined8 *puVar2;
  char cVar3;
  undefined8 uVar4;
  seqStore_t *psVar5;
  U32 lowestValid;
  seqDef *psVar6;
  uint uVar7;
  ulong *puVar8;
  ulong *puVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  BYTE *litEnd_1;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  ulong *puVar19;
  ulong *puVar20;
  U32 UVar21;
  ulong uVar22;
  uint uVar23;
  BYTE *litEnd;
  BYTE *pBVar24;
  ulong *puVar25;
  size_t offbaseFound;
  BYTE *litLimit_w;
  BYTE *pInLoopLimit;
  size_t local_c8;
  uint local_c0;
  uint local_bc;
  ZSTD_matchState_t *local_b8;
  ulong *local_b0;
  uint local_a4;
  ulong *local_a0;
  BYTE *local_98;
  ulong *local_90;
  uint local_84;
  seqStore_t *local_80;
  ulong *local_78;
  ulong *local_70;
  ulong *local_68;
  ulong *local_60;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  long local_48;
  uint *local_40;
  BYTE *local_38;
  
  local_98 = (ms->window).base;
  uVar23 = (ms->window).dictLimit;
  local_38 = local_98 + uVar23;
  local_a4 = (ms->cParams).minMatch;
  if (5 < local_a4) {
    local_a4 = 6;
  }
  if (local_a4 < 5) {
    local_a4 = 4;
  }
  local_4c = (ms->cParams).searchLog;
  local_bc = 6;
  if (local_4c < 6) {
    local_bc = local_4c;
  }
  if (local_bc < 5) {
    local_bc = 4;
  }
  puVar19 = (ulong *)((ulong)((int)src == (int)local_38) + (long)src);
  uVar17 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  iVar18 = (int)puVar19 - (int)local_98;
  local_54 = *rep;
  local_50 = iVar18 - uVar17;
  if (iVar18 - uVar23 <= uVar17) {
    local_50 = uVar23;
  }
  uVar17 = 0;
  if (ms->loadedDictEnd != 0) {
    local_50 = uVar23;
  }
  local_58 = rep[1];
  local_50 = iVar18 - local_50;
  local_84 = local_58;
  if (local_50 < local_58) {
    local_84 = uVar17;
  }
  local_c0 = local_54;
  if (local_50 < local_54) {
    local_c0 = uVar17;
  }
  ms->lazySkipping = 0;
  local_90 = (ulong *)((long)src + (srcSize - 0x10));
  uVar23 = ms->nextToUpdate;
  uVar15 = (ulong)uVar23;
  uVar10 = ((int)local_90 - (int)(local_98 + uVar15)) + 1;
  uVar7 = 8;
  if (uVar10 < 8) {
    uVar7 = uVar10;
  }
  if (local_90 < local_98 + uVar15) {
    uVar7 = uVar17;
  }
  if (uVar23 < uVar7 + uVar23) {
    uVar16 = ms->hashSalt;
    cVar3 = (char)ms->rowHashLog;
    do {
      if (local_a4 == 5) {
        uVar22 = *(long *)(local_98 + uVar15) * -0x30e4432345000000;
LAB_0125254f:
        UVar21 = (U32)((uVar22 ^ uVar16) >> (0x38U - cVar3 & 0x3f));
      }
      else {
        if (local_a4 == 6) {
          uVar22 = *(long *)(local_98 + uVar15) * -0x30e4432340650000;
          goto LAB_0125254f;
        }
        UVar21 = (*(int *)(local_98 + uVar15) * -0x61c8864f ^ (uint)uVar16) >>
                 (0x18U - cVar3 & 0x1f);
      }
      ms->hashCache[(uint)uVar15 & 7] = UVar21;
      uVar15 = uVar15 + 1;
    } while (uVar7 + uVar23 != uVar15);
  }
  puVar20 = (ulong *)(srcSize + (long)src);
  local_40 = rep;
  if (puVar19 < local_90) {
    local_70 = (ulong *)((long)puVar20 + -7);
    local_60 = (ulong *)((long)puVar20 + -3);
    local_68 = (ulong *)((long)puVar20 + -1);
    local_78 = puVar20 + -4;
    local_b8 = ms;
    local_b0 = puVar20;
    local_80 = seqStore;
    do {
      uVar23 = local_c0;
      local_a0 = (ulong *)((long)puVar19 + 1);
      local_48 = -(ulong)local_c0;
      if (local_c0 == 0) {
        uVar15 = 0;
      }
      else {
        uVar15 = 0;
        if (*(int *)((long)local_a0 - (ulong)local_c0) == *(int *)((long)puVar19 + 1)) {
          puVar25 = (ulong *)((long)puVar19 + 5);
          puVar8 = (ulong *)((long)puVar19 + local_48 + 5);
          puVar9 = puVar25;
          if (puVar25 < local_70) {
            if (*puVar8 == *puVar25) {
              lVar11 = 0;
              do {
                puVar9 = (ulong *)((long)puVar19 + lVar11 + 0xd);
                if (local_70 <= puVar9) {
                  puVar8 = (ulong *)((long)puVar19 + local_48 + lVar11 + 0xd);
                  puVar9 = (ulong *)((long)puVar19 + lVar11 + 0xd);
                  goto LAB_012526e8;
                }
                uVar15 = *(ulong *)((long)puVar19 + lVar11 + local_48 + 0xd);
                uVar16 = *puVar9;
                lVar11 = lVar11 + 8;
              } while (uVar15 == uVar16);
              uVar16 = uVar16 ^ uVar15;
              uVar15 = 0;
              if (uVar16 != 0) {
                for (; (uVar16 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                }
              }
              uVar15 = (uVar15 >> 3 & 0x1fffffff) + lVar11;
            }
            else {
              uVar16 = *puVar25 ^ *puVar8;
              uVar15 = 0;
              if (uVar16 != 0) {
                for (; (uVar16 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                }
              }
              uVar15 = uVar15 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_012526e8:
            if ((puVar9 < local_60) && ((int)*puVar8 == (int)*puVar9)) {
              puVar9 = (ulong *)((long)puVar9 + 4);
              puVar8 = (ulong *)((long)puVar8 + 4);
            }
            if ((puVar9 < local_68) && ((short)*puVar8 == (short)*puVar9)) {
              puVar9 = (ulong *)((long)puVar9 + 2);
              puVar8 = (ulong *)((long)puVar8 + 2);
            }
            if (puVar9 < puVar20) {
              puVar9 = (ulong *)((long)puVar9 + (ulong)((BYTE)*puVar8 == (BYTE)*puVar9));
            }
            uVar15 = (long)puVar9 - (long)puVar25;
          }
          uVar15 = uVar15 + 4;
        }
      }
      local_c8 = 999999999;
      if (local_a4 == 6) {
        if (local_bc == 6) {
          uVar16 = ZSTD_RowFindBestMatch_noDict_6_6(ms,(BYTE *)puVar19,(BYTE *)puVar20,&local_c8);
        }
        else if (local_bc == 5) {
          uVar16 = ZSTD_RowFindBestMatch_noDict_6_5(ms,(BYTE *)puVar19,(BYTE *)puVar20,&local_c8);
        }
        else {
          uVar16 = ZSTD_RowFindBestMatch_noDict_6_4(ms,(BYTE *)puVar19,(BYTE *)puVar20,&local_c8);
        }
      }
      else if (local_a4 == 5) {
        if (local_bc == 6) {
          uVar16 = ZSTD_RowFindBestMatch_noDict_5_6(ms,(BYTE *)puVar19,(BYTE *)puVar20,&local_c8);
        }
        else if (local_bc == 5) {
          uVar16 = ZSTD_RowFindBestMatch_noDict_5_5(ms,(BYTE *)puVar19,(BYTE *)puVar20,&local_c8);
        }
        else {
          uVar16 = ZSTD_RowFindBestMatch_noDict_5_4(ms,(BYTE *)puVar19,(BYTE *)puVar20,&local_c8);
        }
      }
      else if (local_bc == 6) {
        uVar16 = ZSTD_RowFindBestMatch_noDict_4_6(ms,(BYTE *)puVar19,(BYTE *)puVar20,&local_c8);
      }
      else if (local_bc == 5) {
        uVar16 = ZSTD_RowFindBestMatch_noDict_4_5(ms,(BYTE *)puVar19,(BYTE *)puVar20,&local_c8);
      }
      else {
        uVar16 = ZSTD_RowFindBestMatch_noDict_4_4(ms,(BYTE *)puVar19,(BYTE *)puVar20,&local_c8);
      }
      uVar22 = uVar15;
      if (uVar15 < uVar16) {
        uVar22 = uVar16;
      }
      if (uVar22 < 4) {
        ms->lazySkipping = (uint)(0x7ff < (ulong)((long)puVar19 - (long)src));
        puVar20 = local_b0;
        puVar19 = (ulong *)((long)puVar19 + ((ulong)((long)puVar19 - (long)src) >> 8) + 1);
        uVar17 = local_84;
      }
      else {
        puVar20 = puVar19;
        uVar13 = local_c8;
        if (uVar16 <= uVar15) {
          puVar20 = local_a0;
          uVar13 = 1;
        }
        uVar15 = uVar22;
        if (puVar19 < local_90) {
          puVar25 = (ulong *)((long)puVar19 + 0xd);
          local_c8 = uVar13;
          local_a0 = puVar20;
          do {
            puVar9 = (ulong *)((long)puVar19 + 1);
            uVar15 = uVar22;
            if (local_c8 == 0) {
              uVar13 = 0;
            }
            else {
              uVar13 = local_c8;
              if ((local_c0 != 0) && (*(int *)puVar9 == *(int *)((long)puVar9 + local_48))) {
                puVar20 = (ulong *)((long)puVar19 + local_48 + 5);
                puVar19 = (ulong *)((long)puVar19 + 5);
                puVar8 = puVar19;
                if (puVar19 < local_70) {
                  puVar8 = puVar25;
                  if (*puVar20 == *puVar19) {
                    do {
                      if (local_70 <= puVar8) {
                        puVar20 = (ulong *)((long)puVar8 + local_48);
                        goto LAB_012528cf;
                      }
                      puVar20 = (ulong *)((long)puVar8 + local_48);
                      uVar16 = *puVar8;
                      puVar8 = puVar8 + 1;
                    } while (*puVar20 == uVar16);
                    uVar16 = uVar16 ^ *puVar20;
                    uVar12 = 0;
                    if (uVar16 != 0) {
                      for (; (uVar16 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                      }
                    }
                    puVar8 = (ulong *)((long)puVar8 + ((uVar12 >> 3 & 0x1fffffff) - 8));
                    goto LAB_0125290c;
                  }
                  uVar12 = *puVar19 ^ *puVar20;
                  uVar16 = 0;
                  if (uVar12 != 0) {
                    for (; (uVar12 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                    }
                  }
                  uVar16 = uVar16 >> 3 & 0x1fffffff;
                }
                else {
LAB_012528cf:
                  if ((puVar8 < local_60) && ((int)*puVar20 == (int)*puVar8)) {
                    puVar8 = (ulong *)((long)puVar8 + 4);
                    puVar20 = (ulong *)((long)puVar20 + 4);
                  }
                  if ((puVar8 < local_68) && ((short)*puVar20 == (short)*puVar8)) {
                    puVar8 = (ulong *)((long)puVar8 + 2);
                    puVar20 = (ulong *)((long)puVar20 + 2);
                  }
                  if (puVar8 < local_b0) {
                    puVar8 = (ulong *)((long)puVar8 + (ulong)((BYTE)*puVar20 == (BYTE)*puVar8));
                  }
LAB_0125290c:
                  uVar16 = (long)puVar8 - (long)puVar19;
                  if (0xfffffffffffffffb < uVar16) goto LAB_0125293c;
                }
                uVar23 = 0x1f;
                if ((uint)local_c8 != 0) {
                  for (; (uint)local_c8 >> uVar23 == 0; uVar23 = uVar23 - 1) {
                  }
                }
                if ((int)((uVar23 ^ 0x1f) + (int)uVar22 * 3 + -0x1e) < (int)(uVar16 + 4) * 3) {
                  uVar13 = 1;
                  uVar15 = uVar16 + 4;
                  local_a0 = puVar9;
                }
              }
            }
LAB_0125293c:
            local_c8 = 999999999;
            if (local_a4 == 6) {
              if (local_bc == 6) {
                uVar22 = ZSTD_RowFindBestMatch_noDict_6_6
                                   (local_b8,(BYTE *)puVar9,(BYTE *)local_b0,&local_c8);
              }
              else if (local_bc == 5) {
                uVar22 = ZSTD_RowFindBestMatch_noDict_6_5
                                   (local_b8,(BYTE *)puVar9,(BYTE *)local_b0,&local_c8);
              }
              else {
                uVar22 = ZSTD_RowFindBestMatch_noDict_6_4
                                   (local_b8,(BYTE *)puVar9,(BYTE *)local_b0,&local_c8);
              }
            }
            else if (local_a4 == 5) {
              if (local_bc == 6) {
                uVar22 = ZSTD_RowFindBestMatch_noDict_5_6
                                   (local_b8,(BYTE *)puVar9,(BYTE *)local_b0,&local_c8);
              }
              else if (local_bc == 5) {
                uVar22 = ZSTD_RowFindBestMatch_noDict_5_5
                                   (local_b8,(BYTE *)puVar9,(BYTE *)local_b0,&local_c8);
              }
              else {
                uVar22 = ZSTD_RowFindBestMatch_noDict_5_4
                                   (local_b8,(BYTE *)puVar9,(BYTE *)local_b0,&local_c8);
              }
            }
            else if (local_bc == 6) {
              uVar22 = ZSTD_RowFindBestMatch_noDict_4_6
                                 (local_b8,(BYTE *)puVar9,(BYTE *)local_b0,&local_c8);
            }
            else if (local_bc == 5) {
              uVar22 = ZSTD_RowFindBestMatch_noDict_4_5
                                 (local_b8,(BYTE *)puVar9,(BYTE *)local_b0,&local_c8);
            }
            else {
              uVar22 = ZSTD_RowFindBestMatch_noDict_4_4
                                 (local_b8,(BYTE *)puVar9,(BYTE *)local_b0,&local_c8);
            }
            puVar20 = local_a0;
            if (uVar22 < 4) break;
            uVar23 = 0x1f;
            if ((uint)uVar13 != 0) {
              for (; (uint)uVar13 >> uVar23 == 0; uVar23 = uVar23 - 1) {
              }
            }
            iVar18 = 0x1f;
            if ((uint)local_c8 != 0) {
              for (; (uint)local_c8 >> iVar18 == 0; iVar18 = iVar18 + -1) {
              }
            }
            if (((int)uVar22 * 4 - iVar18 <= (int)((uVar23 ^ 0x1f) + (int)uVar15 * 4 + -0x1b)) ||
               (puVar25 = (ulong *)((long)puVar25 + 1), puVar19 = puVar9, uVar13 = local_c8,
               puVar20 = puVar9, uVar15 = uVar22, local_a0 = puVar9, local_90 <= puVar9)) break;
          } while( true );
        }
        uVar23 = local_a4;
        if (3 < uVar13) {
          if ((src < puVar20) && (local_38 < (BYTE *)((long)puVar20 + (3 - uVar13)))) {
            puVar19 = puVar20;
            while (puVar20 = puVar19,
                  *(BYTE *)((long)puVar19 + -1) == *(BYTE *)((long)puVar19 + (2 - uVar13))) {
              puVar20 = (ulong *)((long)puVar19 + -1);
              uVar15 = uVar15 + 1;
              if ((puVar20 <= src) ||
                 (pBVar24 = (BYTE *)((long)puVar19 + (2 - uVar13)), puVar19 = puVar20,
                 pBVar24 <= local_38)) break;
            }
          }
          local_84 = local_c0;
          local_c0 = (U32)uVar13 - 3;
        }
        uVar16 = (long)puVar20 - (long)src;
        puVar19 = (ulong *)local_80->lit;
        if (local_78 < puVar20) {
          ZSTD_safecopyLiterals((BYTE *)puVar19,(BYTE *)src,(BYTE *)puVar20,(BYTE *)local_78);
LAB_01252b53:
          local_80->lit = local_80->lit + uVar16;
          psVar6 = local_80->sequences;
          if (0xffff < uVar16) {
            local_80->longLengthType = ZSTD_llt_literalLength;
            local_80->longLengthPos =
                 (U32)((ulong)((long)psVar6 - (long)local_80->sequencesStart) >> 3);
          }
        }
        else {
          uVar22 = *(ulong *)((long)src + 8);
          *puVar19 = *src;
          puVar19[1] = uVar22;
          pBVar24 = local_80->lit;
          if (0x10 < uVar16) {
            uVar22 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar24 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar24 + 0x18) = uVar22;
            if (0x20 < (long)uVar16) {
              lVar11 = 0;
              do {
                puVar2 = (undefined8 *)((long)src + lVar11 + 0x20);
                uVar4 = puVar2[1];
                pBVar1 = pBVar24 + lVar11 + 0x20;
                *(undefined8 *)pBVar1 = *puVar2;
                *(undefined8 *)(pBVar1 + 8) = uVar4;
                puVar2 = (undefined8 *)((long)src + lVar11 + 0x30);
                uVar4 = puVar2[1];
                *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
                *(undefined8 *)(pBVar1 + 0x18) = uVar4;
                lVar11 = lVar11 + 0x20;
              } while (pBVar1 + 0x20 < pBVar24 + uVar16);
            }
            goto LAB_01252b53;
          }
          local_80->lit = pBVar24 + uVar16;
          psVar6 = local_80->sequences;
        }
        ms = local_b8;
        psVar6->litLength = (U16)uVar16;
        psVar6->offBase = (U32)uVar13;
        if (0xffff < uVar15 - 3) {
          local_80->longLengthType = ZSTD_llt_matchLength;
          local_80->longLengthPos =
               (U32)((ulong)((long)psVar6 - (long)local_80->sequencesStart) >> 3);
        }
        psVar6->mlBase = (U16)(uVar15 - 3);
        local_80->sequences = psVar6 + 1;
        if (local_b8->lazySkipping != 0) {
          uVar17 = local_b8->nextToUpdate;
          uVar16 = (ulong)uVar17;
          uVar7 = ((int)local_90 - (int)(local_98 + uVar16)) + 1;
          if (7 < uVar7) {
            uVar7 = 8;
          }
          if (local_90 < local_98 + uVar16) {
            uVar7 = 0;
          }
          if (uVar17 < uVar7 + uVar17) {
            uVar22 = local_b8->hashSalt;
            cVar3 = (char)local_b8->rowHashLog;
            do {
              if (uVar23 == 5) {
                uVar13 = *(long *)(local_98 + uVar16) * -0x30e4432345000000;
LAB_01252cc1:
                UVar21 = (U32)((uVar13 ^ uVar22) >> (0x38U - cVar3 & 0x3f));
              }
              else {
                if (uVar23 == 6) {
                  uVar13 = *(long *)(local_98 + uVar16) * -0x30e4432340650000;
                  goto LAB_01252cc1;
                }
                UVar21 = (*(int *)(local_98 + uVar16) * -0x61c8864f ^ (uint)uVar22) >>
                         (0x18U - cVar3 & 0x1f);
              }
              local_b8->hashCache[(uint)uVar16 & 7] = UVar21;
              uVar16 = uVar16 + 1;
            } while (uVar7 + uVar17 != uVar16);
          }
          local_b8->lazySkipping = 0;
        }
        src = (void *)((long)puVar20 + uVar15);
        puVar20 = local_b0;
        puVar19 = (ulong *)src;
        uVar23 = local_c0;
        uVar17 = local_84;
        if ((local_84 != 0) && (uVar7 = local_c0, src <= local_90)) {
          while (uVar10 = uVar7, uVar7 = uVar17, psVar5 = local_80, puVar19 = (ulong *)src,
                uVar23 = uVar10, uVar17 = uVar7, (int)*src == *(int *)((long)src - (ulong)uVar7)) {
            lVar11 = -(ulong)uVar7;
            puVar19 = (ulong *)((long)src + 4);
            puVar9 = (ulong *)((long)src + lVar11 + 4);
            puVar25 = puVar19;
            if (puVar19 < local_70) {
              if (*puVar9 == *puVar19) {
                lVar14 = 0;
                do {
                  puVar25 = (ulong *)((long)src + lVar14 + 0xc);
                  if (local_70 <= puVar25) {
                    puVar9 = (ulong *)((long)src + lVar11 + lVar14 + 0xc);
                    puVar25 = (ulong *)((long)src + lVar14 + 0xc);
                    goto LAB_01252e0c;
                  }
                  uVar15 = *(ulong *)((long)src + lVar14 + lVar11 + 0xc);
                  uVar16 = *puVar25;
                  lVar14 = lVar14 + 8;
                } while (uVar15 == uVar16);
                uVar16 = uVar16 ^ uVar15;
                uVar15 = 0;
                if (uVar16 != 0) {
                  for (; (uVar16 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                  }
                }
                uVar15 = (uVar15 >> 3 & 0x1fffffff) + lVar14;
              }
              else {
                uVar16 = *puVar19 ^ *puVar9;
                uVar15 = 0;
                if (uVar16 != 0) {
                  for (; (uVar16 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                  }
                }
                uVar15 = uVar15 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_01252e0c:
              if ((puVar25 < local_60) && ((int)*puVar9 == (int)*puVar25)) {
                puVar25 = (ulong *)((long)puVar25 + 4);
                puVar9 = (ulong *)((long)puVar9 + 4);
              }
              if ((puVar25 < local_68) && ((short)*puVar9 == (short)*puVar25)) {
                puVar25 = (ulong *)((long)puVar25 + 2);
                puVar9 = (ulong *)((long)puVar9 + 2);
              }
              if (puVar25 < puVar20) {
                puVar25 = (ulong *)((long)puVar25 + (ulong)((BYTE)*puVar9 == (BYTE)*puVar25));
              }
              uVar15 = (long)puVar25 - (long)puVar19;
            }
            puVar19 = (ulong *)local_80->lit;
            if (local_78 < src) {
              ZSTD_safecopyLiterals((BYTE *)puVar19,(BYTE *)src,(BYTE *)src,(BYTE *)local_78);
              puVar20 = local_b0;
            }
            else {
              uVar16 = *(ulong *)((long)src + 8);
              *puVar19 = *src;
              puVar19[1] = uVar16;
            }
            psVar6 = psVar5->sequences;
            psVar6->litLength = 0;
            psVar6->offBase = 1;
            if (0xffff < uVar15 + 1) {
              psVar5->longLengthType = ZSTD_llt_matchLength;
              psVar5->longLengthPos =
                   (U32)((ulong)((long)psVar6 - (long)psVar5->sequencesStart) >> 3);
            }
            psVar6->mlBase = (U16)(uVar15 + 1);
            psVar5->sequences = psVar6 + 1;
            src = (void *)((long)src + uVar15 + 4);
            puVar19 = (ulong *)src;
            uVar23 = uVar7;
            uVar17 = uVar10;
            if ((uVar10 == 0) || (local_90 < src)) break;
          }
        }
      }
      local_84 = uVar17;
      local_c0 = uVar23;
    } while (puVar19 < local_90);
  }
  if (local_58 <= local_50) {
    local_58 = 0;
  }
  uVar23 = local_58;
  if (local_c0 != 0) {
    uVar23 = local_54;
  }
  if (local_54 <= local_50) {
    uVar23 = local_58;
    local_54 = 0;
  }
  if (local_c0 != 0) {
    local_54 = local_c0;
  }
  if (local_84 != 0) {
    uVar23 = local_84;
  }
  *local_40 = local_54;
  local_40[1] = uVar23;
  return (long)puVar20 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_lazy_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 1, ZSTD_noDict);
}